

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachments
          (Impl *this,Value *attachments,VkAttachmentReference **out_references)

{
  SizeType SVar1;
  VkAttachmentReference *pVVar2;
  ValueIterator value_00;
  ValueIterator pGVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  VkAttachmentReference *ref;
  
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(attachments);
  pVVar2 = ScratchAllocator::allocate_n_cleared<VkAttachmentReference>
                     (&this->allocator,(ulong)SVar1);
  value_00 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::Begin(attachments);
  ref = pVVar2;
  while( true ) {
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(attachments);
    if (value_00 == pGVar3) break;
    parse_attachment_base<VkAttachmentReference>(ref,value_00);
    value_00 = value_00 + 1;
    ref = ref + 1;
  }
  *out_references = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_attachments(const Value &attachments, const VkAttachmentReference **out_references)
{
	auto *refs = allocator.allocate_n_cleared<VkAttachmentReference>(attachments.Size());
	auto *ret = refs;

	for (auto itr = attachments.Begin(); itr != attachments.End(); ++itr, refs++)
	{
		auto &value = *itr;
		parse_attachment_base(*refs, value);
	}

	*out_references = ret;
	return true;
}